

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader14.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::MeshLoader14::begin__input____InputLocalOffset
          (MeshLoader14 *this,input____InputLocalOffset__AttributeData *attributeData)

{
  int iVar1;
  byte bVar2;
  uint local_28 [2];
  uint64 local_20;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  uint64 local_8;
  
  local_18 = *(undefined4 *)&attributeData->semantic;
  uStack_14 = *(undefined4 *)((long)&attributeData->semantic + 4);
  uStack_10 = *(undefined4 *)&attributeData->source;
  uStack_c = *(undefined4 *)((long)&attributeData->source + 4);
  bVar2 = (attributeData->present_attributes & 1) != 0;
  if ((bool)bVar2) {
    local_20 = attributeData->offset;
  }
  if ((attributeData->present_attributes & 2) != 0) {
    local_8 = attributeData->set;
    bVar2 = bVar2 | 2;
  }
  local_28[0] = (uint)bVar2;
  iVar1 = (*(this->mLoader->super_SourceArrayLoader).super_FilePartLoader.super_IFilePartLoader.
            super_ExtraDataLoader._vptr_ExtraDataLoader[0x21])(this->mLoader,local_28);
  return SUB41(iVar1,0);
}

Assistant:

bool MeshLoader14::begin__input____InputLocalOffset( const COLLADASaxFWL14::input____InputLocalOffset__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__input____InputLocalOffset(attributeData));
COLLADASaxFWL::input____InputLocalOffset__AttributeData attrData;
attrData.present_attributes = 0;
attrData.semantic = attributeData.semantic;
attrData.source = attributeData.source;
if ( (attributeData.present_attributes & COLLADASaxFWL14::input____InputLocalOffset__AttributeData::ATTRIBUTE_OFFSET_PRESENT) == COLLADASaxFWL14::input____InputLocalOffset__AttributeData::ATTRIBUTE_OFFSET_PRESENT ) {
    attrData.offset = attributeData.offset;
    attrData.present_attributes |= COLLADASaxFWL::input____InputLocalOffset__AttributeData::ATTRIBUTE_OFFSET_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL14::input____InputLocalOffset__AttributeData::ATTRIBUTE_SET_PRESENT) == COLLADASaxFWL14::input____InputLocalOffset__AttributeData::ATTRIBUTE_SET_PRESENT ) {
    attrData.set = attributeData.set;
    attrData.present_attributes |= COLLADASaxFWL::input____InputLocalOffset__AttributeData::ATTRIBUTE_SET_PRESENT;
}
return mLoader->begin__input____InputLocalOffset(attrData);
}